

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
bssl::InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::PushBack
          (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this,
          vector<int,_std::allocator<int>_> *val)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *ret;
  vector<int,_std::allocator<int>_> *val_local;
  InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this_local;
  
  ret = val;
  val_local = (vector<int,_std::allocator<int>_> *)this;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,val);
  pvVar1 = TryPushBack(this,&local_38);
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  if (pvVar1 == (vector<int,_std::allocator<int>_> *)0x0) {
    local_20 = pvVar1;
    abort();
  }
  return pvVar1;
}

Assistant:

T &PushBack(T val) {
    T *ret = TryPushBack(std::move(val));
    BSSL_CHECK(ret != nullptr);
    return *ret;
  }